

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::SolverParameter::InternalSerializeWithCachedSizesToArray
          (SolverParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  string *psVar2;
  char *data;
  Type *pTVar3;
  uint8 *puVar4;
  Type *value;
  Type *value_00;
  UnknownFieldSet *unknown_fields;
  int iVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar6;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->train_net_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.train_net");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (1,(this->train_net_).ptr_,target);
  }
  iVar5 = (this->test_net_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  this_00 = &this->test_net_;
  for (; iVar5 != iVar6; iVar6 = iVar6 + 1) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar6);
    data = (pTVar3->_M_dataplus)._M_p;
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar6);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,(int)pTVar3->_M_string_length,SERIALIZE,"caffe.SolverParameter.test_net");
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar6);
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray(2,pTVar3,target);
  }
  puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3,&this->test_iter_,target)
  ;
  if ((uVar1 >> 9 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (4,this->test_interval_,puVar4);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(5,this->base_lr_,puVar4);
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(6,this->display_,puVar4);
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(7,this->max_iter_,puVar4)
    ;
  }
  if ((uVar1 & 2) != 0) {
    psVar2 = (this->lr_policy_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.lr_policy");
    puVar4 = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (8,(this->lr_policy_).ptr_,puVar4);
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(9,this->gamma_,puVar4);
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(10,this->power_,puVar4);
  }
  if ((short)uVar1 < 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (0xb,this->momentum_,puVar4);
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (0xc,this->weight_decay_,puVar4);
  }
  if ((uVar1 >> 0x11 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0xd,this->stepsize_,puVar4);
  }
  if ((uVar1 >> 0x12 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0xe,this->snapshot_,puVar4);
  }
  if ((uVar1 & 4) != 0) {
    psVar2 = (this->snapshot_prefix_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.snapshot_prefix");
    puVar4 = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (0xf,(this->snapshot_prefix_).ptr_,puVar4);
  }
  if ((uVar1 >> 0x15 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (0x10,this->snapshot_diff_,puVar4);
  }
  if ((uVar1 >> 0x1a & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x11,this->solver_mode_,puVar4);
  }
  if ((uVar1 >> 0x13 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0x12,this->device_id_,puVar4);
  }
  if ((uVar1 >> 0x14 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (0x13,this->test_compute_loss_,puVar4);
  }
  if ((uVar1 >> 0x19 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteInt64ToArray
                       (0x14,this->random_seed_,puVar4);
  }
  if ((uVar1 & 0x40) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::NetParameter>
                       (0x15,this->train_net_param_,deterministic,puVar4);
  }
  iVar5 = (this->test_net_param_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar5 != iVar6; iVar6 = iVar6 + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::NetParameter>::TypeHandler>
                      (&(this->test_net_param_).super_RepeatedPtrFieldBase,iVar6);
    puVar4 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::NetParameter>
                       (0x16,value,deterministic,puVar4);
  }
  if ((uVar1 >> 0x16 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (0x17,this->debug_info_,puVar4);
  }
  if ((uVar1 & 8) != 0) {
    psVar2 = (this->net_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.net");
    puVar4 = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (0x18,(this->net_).ptr_,puVar4);
  }
  if ((char)uVar1 < '\0') {
    puVar4 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::NetParameter>
                       (0x19,this->net_param_,deterministic,puVar4);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::NetState>
                       (0x1a,this->train_state_,deterministic,puVar4);
  }
  iVar5 = (this->test_state_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar5 != iVar6; iVar6 = iVar6 + 1) {
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::NetState>::TypeHandler>
                         (&(this->test_state_).super_RepeatedPtrFieldBase,iVar6);
    puVar4 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::NetState>
                       (0x1b,value_00,deterministic,puVar4);
  }
  if ((uVar1 >> 0x1c & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (0x1c,this->snapshot_after_train_,puVar4);
  }
  if ((uVar1 & 0x10) != 0) {
    psVar2 = (this->regularization_type_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.regularization_type");
    puVar4 = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (0x1d,(this->regularization_type_).ptr_,puVar4);
  }
  if ((uVar1 >> 0x17 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x1e,this->solver_type_,puVar4);
  }
  if ((uVar1 >> 0x1d & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x1f,this->delta_,puVar4)
    ;
  }
  if ((uVar1 >> 0x1b & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (0x20,this->test_initialization_,puVar4);
  }
  if ((uVar1 >> 0x1e & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0x21,this->average_loss_,puVar4);
  }
  puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                     (0x22,&this->stepvalue_,puVar4);
  if ((int)uVar1 < 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (0x23,this->clip_gradients_,puVar4);
  }
  uVar1 = (this->_has_bits_).has_bits_[1];
  if ((uVar1 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0x24,this->iter_size_,puVar4);
  }
  if ((uVar1 & 2) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x25,this->snapshot_format_,puVar4);
  }
  if ((uVar1 & 4) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (0x26,this->rms_decay_,puVar4);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 >> 0x18 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (0x27,this->momentum2_,puVar4);
  }
  if ((uVar1 & 0x20) != 0) {
    psVar2 = (this->type_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.SolverParameter.type");
    puVar4 = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (0x28,(this->type_).ptr_,puVar4);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    unknown_fields = SolverParameter::unknown_fields(this);
    puVar4 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       (unknown_fields,puVar4);
    return puVar4;
  }
  return puVar4;
}

Assistant:

::google::protobuf::uint8* SolverParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.SolverParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string train_net = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->train_net().data(), this->train_net().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.train_net");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->train_net(), target);
  }

  // repeated string test_net = 2;
  for (int i = 0, n = this->test_net_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->test_net(i).data(), this->test_net(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.test_net");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(2, this->test_net(i), target);
  }

  // repeated int32 test_iter = 3;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(3, this->test_iter_, target);

  // optional int32 test_interval = 4 [default = 0];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4, this->test_interval(), target);
  }

  // optional float base_lr = 5;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(5, this->base_lr(), target);
  }

  // optional int32 display = 6;
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(6, this->display(), target);
  }

  // optional int32 max_iter = 7;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(7, this->max_iter(), target);
  }

  // optional string lr_policy = 8;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->lr_policy().data(), this->lr_policy().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.lr_policy");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        8, this->lr_policy(), target);
  }

  // optional float gamma = 9;
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(9, this->gamma(), target);
  }

  // optional float power = 10;
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(10, this->power(), target);
  }

  // optional float momentum = 11;
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(11, this->momentum(), target);
  }

  // optional float weight_decay = 12;
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(12, this->weight_decay(), target);
  }

  // optional int32 stepsize = 13;
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(13, this->stepsize(), target);
  }

  // optional int32 snapshot = 14 [default = 0];
  if (cached_has_bits & 0x00040000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(14, this->snapshot(), target);
  }

  // optional string snapshot_prefix = 15;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->snapshot_prefix().data(), this->snapshot_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.snapshot_prefix");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        15, this->snapshot_prefix(), target);
  }

  // optional bool snapshot_diff = 16 [default = false];
  if (cached_has_bits & 0x00200000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(16, this->snapshot_diff(), target);
  }

  // optional .caffe.SolverParameter.SolverMode solver_mode = 17 [default = GPU];
  if (cached_has_bits & 0x04000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      17, this->solver_mode(), target);
  }

  // optional int32 device_id = 18 [default = 0];
  if (cached_has_bits & 0x00080000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(18, this->device_id(), target);
  }

  // optional bool test_compute_loss = 19 [default = false];
  if (cached_has_bits & 0x00100000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(19, this->test_compute_loss(), target);
  }

  // optional int64 random_seed = 20 [default = -1];
  if (cached_has_bits & 0x02000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt64ToArray(20, this->random_seed(), target);
  }

  // optional .caffe.NetParameter train_net_param = 21;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        21, *this->train_net_param_, deterministic, target);
  }

  // repeated .caffe.NetParameter test_net_param = 22;
  for (unsigned int i = 0, n = this->test_net_param_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        22, this->test_net_param(i), deterministic, target);
  }

  // optional bool debug_info = 23 [default = false];
  if (cached_has_bits & 0x00400000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(23, this->debug_info(), target);
  }

  // optional string net = 24;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->net().data(), this->net().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.net");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        24, this->net(), target);
  }

  // optional .caffe.NetParameter net_param = 25;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        25, *this->net_param_, deterministic, target);
  }

  // optional .caffe.NetState train_state = 26;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        26, *this->train_state_, deterministic, target);
  }

  // repeated .caffe.NetState test_state = 27;
  for (unsigned int i = 0, n = this->test_state_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        27, this->test_state(i), deterministic, target);
  }

  // optional bool snapshot_after_train = 28 [default = true];
  if (cached_has_bits & 0x10000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(28, this->snapshot_after_train(), target);
  }

  // optional string regularization_type = 29 [default = "L2"];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->regularization_type().data(), this->regularization_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.regularization_type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        29, this->regularization_type(), target);
  }

  // optional .caffe.SolverParameter.SolverType solver_type = 30 [default = SGD];
  if (cached_has_bits & 0x00800000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      30, this->solver_type(), target);
  }

  // optional float delta = 31 [default = 1e-08];
  if (cached_has_bits & 0x20000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(31, this->delta(), target);
  }

  // optional bool test_initialization = 32 [default = true];
  if (cached_has_bits & 0x08000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(32, this->test_initialization(), target);
  }

  // optional int32 average_loss = 33 [default = 1];
  if (cached_has_bits & 0x40000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(33, this->average_loss(), target);
  }

  // repeated int32 stepvalue = 34;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(34, this->stepvalue_, target);

  // optional float clip_gradients = 35 [default = -1];
  if (cached_has_bits & 0x80000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(35, this->clip_gradients(), target);
  }

  cached_has_bits = _has_bits_[1];
  // optional int32 iter_size = 36 [default = 1];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(36, this->iter_size(), target);
  }

  // optional .caffe.SolverParameter.SnapshotFormat snapshot_format = 37 [default = BINARYPROTO];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      37, this->snapshot_format(), target);
  }

  // optional float rms_decay = 38 [default = 0.99];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(38, this->rms_decay(), target);
  }

  cached_has_bits = _has_bits_[0];
  // optional float momentum2 = 39 [default = 0.999];
  if (cached_has_bits & 0x01000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(39, this->momentum2(), target);
  }

  // optional string type = 40 [default = "SGD"];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        40, this->type(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.SolverParameter)
  return target;
}